

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O2

void __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::compute_median
          (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
           *this,vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                 *maps)

{
  pointer ppPVar1;
  pointer ppPVar2;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *pPVar3;
  double dVar4;
  pointer pdVar5;
  pointer pvVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  allocator_type local_61;
  vector<double,_std::allocator<double>_> to_compute_median;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  heat_maps;
  
  check_and_initialize_maps(&heat_maps,this,maps);
  std::vector<double,_std::allocator<double>_>::vector
            (&to_compute_median,
             (long)(maps->
                   super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(maps->
                   super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3,&local_61);
  pvVar6 = heat_maps.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (lVar9 = 0;
      lVar9 != ((long)heat_maps.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6) / 0x18;
      lVar9 = lVar9 + 1) {
    pdVar5 = pvVar6[lVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar7 = 0;
        lVar7 != (long)pvVar6[lVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar5 >> 3; lVar7 = lVar7 + 1) {
      ppPVar1 = (maps->
                super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppPVar2 = (maps->
                super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      for (lVar8 = 0; (long)ppPVar2 - (long)ppPVar1 >> 3 != lVar8; lVar8 = lVar8 + 1) {
        to_compute_median.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar8] =
             *(double *)
              (*(long *)(*(long *)&(ppPVar1[lVar8]->heat_map).
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data + lVar9 * 0x18) + lVar7 * 8);
      }
      std::
      nth_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 to_compute_median.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (double *)
                 (((long)to_compute_median.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)to_compute_median.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 1 & 0xfffffffffffffff8U) +
                 (long)to_compute_median.super__Vector_base<double,_std::allocator<double>_>._M_impl
                       .super__Vector_impl_data._M_start),
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 to_compute_median.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      pdVar5 = heat_maps.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar9].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar5[lVar7] =
           *(double *)
            ((long)to_compute_median.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start +
            ((long)to_compute_median.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)to_compute_median.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 1 & 0xfffffffffffffff8U));
      pvVar6 = heat_maps.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&this->heat_map,&heat_maps);
  pPVar3 = *(maps->
            super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar4 = pPVar3->max_;
  this->min_ = pPVar3->min_;
  this->max_ = dVar4;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&to_compute_median.super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&heat_maps);
  return;
}

Assistant:

void Persistence_heat_maps<Scalling_of_kernels>::compute_median(const std::vector<Persistence_heat_maps*>& maps) {
  std::vector<std::vector<double> > heat_maps = this->check_and_initialize_maps(maps);

  std::vector<double> to_compute_median(maps.size());
  for (size_t i = 0; i != heat_maps.size(); ++i) {
    for (size_t j = 0; j != heat_maps[i].size(); ++j) {
      for (size_t map_no = 0; map_no != maps.size(); ++map_no) {
        to_compute_median[map_no] = maps[map_no]->heat_map[i][j];
      }
      std::nth_element(to_compute_median.begin(), to_compute_median.begin() + to_compute_median.size() / 2,
                       to_compute_median.end());
      heat_maps[i][j] = to_compute_median[to_compute_median.size() / 2];
    }
  }
  this->heat_map = heat_maps;
  this->min_ = maps[0]->min_;
  this->max_ = maps[0]->max_;
}